

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

int luaD_reallocstack(lua_State *L,int newsize,int raiseerror)

{
  lu_byte lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  StkId pSVar31;
  UpVal *pUVar32;
  CallInfo *pCVar33;
  undefined1 *puVar34;
  StkId oldstack;
  ulong uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  undefined1 auVar39 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar59;
  int iVar62;
  int iVar63;
  undefined1 auVar60 [16];
  int iVar64;
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar78;
  int iVar82;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  
  pSVar31 = (L->stack_last).p;
  oldstack = (L->stack).p;
  lVar1 = L->l_G->gcstopem;
  (L->top).p = (StkId)((long)(L->top).p - (long)oldstack);
  (L->tbclist).p = (StkId)((long)(L->tbclist).p - (long)oldstack);
  for (pUVar32 = L->openupval; pUVar32 != (UpVal *)0x0; pUVar32 = (pUVar32->u).open.next) {
    (pUVar32->v).p = (TValue *)((long)(pUVar32->v).p - (L->stack).offset);
  }
  uVar35 = (long)pSVar31 - (long)oldstack;
  for (pCVar33 = L->ci; pCVar33 != (CallInfo *)0x0; pCVar33 = pCVar33->previous) {
    (pCVar33->top).p = (StkId)((long)(pCVar33->top).p - (L->stack).offset);
    (pCVar33->func).p = (StkId)((long)(pCVar33->func).p - (L->stack).offset);
  }
  L->l_G->gcstopem = '\x01';
  lVar38 = (long)(uVar35 * 0x10000000 + 0x500000000) >> 0x20;
  lVar36 = (long)newsize + 5;
  pSVar31 = (StkId)luaM_realloc_(L,oldstack,lVar38 * 0x10,lVar36 * 0x10);
  L->l_G->gcstopem = lVar1;
  if (pSVar31 == (StkId)0x0) {
    correctstack(L,oldstack);
    iVar30 = 0;
    if (raiseerror != 0) {
      luaD_throw(L,'\x04');
    }
  }
  else {
    (L->stack).p = pSVar31;
    correctstack(L,oldstack);
    (L->stack_last).p = (L->stack).p + newsize;
    auVar29 = _DAT_0012cad0;
    auVar28 = _DAT_0012cac0;
    auVar27 = _DAT_0012cab0;
    auVar26 = _DAT_0012caa0;
    auVar25 = _DAT_0012ca90;
    auVar24 = _DAT_0012ca80;
    auVar23 = _DAT_0012ca70;
    iVar30 = 1;
    if ((int)(uVar35 >> 4) < newsize) {
      if (lVar36 < lVar38 + 1) {
        lVar36 = lVar38 + 1;
      }
      lVar37 = (lVar36 - lVar38) + -1;
      auVar39._8_4_ = (int)lVar37;
      auVar39._0_8_ = lVar37;
      auVar39._12_4_ = (int)((ulong)lVar37 >> 0x20);
      puVar34 = (undefined1 *)((long)pSVar31 + lVar38 * 0x10 + 0xf8U);
      uVar35 = 0;
      do {
        auVar57._8_4_ = (int)uVar35;
        auVar57._0_8_ = uVar35;
        auVar57._12_4_ = (int)(uVar35 >> 0x20);
        auVar60 = auVar39 ^ auVar29;
        auVar65 = (auVar57 | auVar28) ^ auVar29;
        iVar59 = auVar60._0_4_;
        iVar78 = -(uint)(iVar59 < auVar65._0_4_);
        iVar62 = auVar60._4_4_;
        auVar67._4_4_ = -(uint)(iVar62 < auVar65._4_4_);
        iVar63 = auVar60._8_4_;
        iVar82 = -(uint)(iVar63 < auVar65._8_4_);
        iVar64 = auVar60._12_4_;
        auVar67._12_4_ = -(uint)(iVar64 < auVar65._12_4_);
        auVar40._4_4_ = iVar78;
        auVar40._0_4_ = iVar78;
        auVar40._8_4_ = iVar82;
        auVar40._12_4_ = iVar82;
        auVar40 = pshuflw(in_XMM1,auVar40,0xe8);
        auVar66._4_4_ = -(uint)(auVar65._4_4_ == iVar62);
        auVar66._12_4_ = -(uint)(auVar65._12_4_ == iVar64);
        auVar66._0_4_ = auVar66._4_4_;
        auVar66._8_4_ = auVar66._12_4_;
        auVar49 = pshuflw(in_XMM2,auVar66,0xe8);
        auVar67._0_4_ = auVar67._4_4_;
        auVar67._8_4_ = auVar67._12_4_;
        auVar65 = pshuflw(auVar40,auVar67,0xe8);
        auVar60._8_4_ = 0xffffffff;
        auVar60._0_8_ = 0xffffffffffffffff;
        auVar60._12_4_ = 0xffffffff;
        auVar60 = (auVar65 | auVar49 & auVar40) ^ auVar60;
        auVar60 = packssdw(auVar60,auVar60);
        if ((auVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          puVar34[-0xf0] = 0;
        }
        auVar49._4_4_ = iVar78;
        auVar49._0_4_ = iVar78;
        auVar49._8_4_ = iVar82;
        auVar49._12_4_ = iVar82;
        auVar67 = auVar66 & auVar49 | auVar67;
        auVar60 = packssdw(auVar67,auVar67);
        auVar65._8_4_ = 0xffffffff;
        auVar65._0_8_ = 0xffffffffffffffff;
        auVar65._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60 ^ auVar65,auVar60 ^ auVar65);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60._0_4_ >> 8 & 1) != 0) {
          puVar34[-0xe0] = 0;
        }
        auVar60 = (auVar57 | auVar27) ^ auVar29;
        auVar50._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
        auVar50._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
        auVar50._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
        auVar50._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
        auVar68._4_4_ = auVar50._0_4_;
        auVar68._0_4_ = auVar50._0_4_;
        auVar68._8_4_ = auVar50._8_4_;
        auVar68._12_4_ = auVar50._8_4_;
        iVar78 = -(uint)(auVar60._4_4_ == iVar62);
        iVar82 = -(uint)(auVar60._12_4_ == iVar64);
        auVar11._4_4_ = iVar78;
        auVar11._0_4_ = iVar78;
        auVar11._8_4_ = iVar82;
        auVar11._12_4_ = iVar82;
        auVar79._4_4_ = auVar50._4_4_;
        auVar79._0_4_ = auVar50._4_4_;
        auVar79._8_4_ = auVar50._12_4_;
        auVar79._12_4_ = auVar50._12_4_;
        auVar60 = auVar11 & auVar68 | auVar79;
        auVar60 = packssdw(auVar60,auVar60);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60 ^ auVar2,auVar60 ^ auVar2);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60._0_4_ >> 0x10 & 1) != 0) {
          puVar34[-0xd0] = 0;
        }
        auVar60 = pshufhw(auVar60,auVar68,0x84);
        auVar12._4_4_ = iVar78;
        auVar12._0_4_ = iVar78;
        auVar12._8_4_ = iVar82;
        auVar12._12_4_ = iVar82;
        auVar65 = pshufhw(auVar50,auVar12,0x84);
        auVar40 = pshufhw(auVar60,auVar79,0x84);
        auVar41._8_4_ = 0xffffffff;
        auVar41._0_8_ = 0xffffffffffffffff;
        auVar41._12_4_ = 0xffffffff;
        auVar41 = (auVar40 | auVar65 & auVar60) ^ auVar41;
        auVar60 = packssdw(auVar41,auVar41);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60._0_4_ >> 0x18 & 1) != 0) {
          puVar34[-0xc0] = 0;
        }
        auVar60 = (auVar57 | auVar26) ^ auVar29;
        auVar51._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
        auVar51._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
        auVar51._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
        auVar51._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
        auVar13._4_4_ = auVar51._0_4_;
        auVar13._0_4_ = auVar51._0_4_;
        auVar13._8_4_ = auVar51._8_4_;
        auVar13._12_4_ = auVar51._8_4_;
        auVar65 = pshuflw(auVar79,auVar13,0xe8);
        auVar42._0_4_ = -(uint)(auVar60._0_4_ == iVar59);
        auVar42._4_4_ = -(uint)(auVar60._4_4_ == iVar62);
        auVar42._8_4_ = -(uint)(auVar60._8_4_ == iVar63);
        auVar42._12_4_ = -(uint)(auVar60._12_4_ == iVar64);
        auVar69._4_4_ = auVar42._4_4_;
        auVar69._0_4_ = auVar42._4_4_;
        auVar69._8_4_ = auVar42._12_4_;
        auVar69._12_4_ = auVar42._12_4_;
        auVar60 = pshuflw(auVar42,auVar69,0xe8);
        auVar70._4_4_ = auVar51._4_4_;
        auVar70._0_4_ = auVar51._4_4_;
        auVar70._8_4_ = auVar51._12_4_;
        auVar70._12_4_ = auVar51._12_4_;
        auVar40 = pshuflw(auVar51,auVar70,0xe8);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60 & auVar65,(auVar40 | auVar60 & auVar65) ^ auVar3);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          puVar34[-0xb0] = 0;
        }
        auVar14._4_4_ = auVar51._0_4_;
        auVar14._0_4_ = auVar51._0_4_;
        auVar14._8_4_ = auVar51._8_4_;
        auVar14._12_4_ = auVar51._8_4_;
        auVar70 = auVar69 & auVar14 | auVar70;
        auVar40 = packssdw(auVar70,auVar70);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60,auVar40 ^ auVar4);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60._4_2_ >> 8 & 1) != 0) {
          puVar34[-0xa0] = 0;
        }
        auVar60 = (auVar57 | auVar25) ^ auVar29;
        auVar52._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
        auVar52._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
        auVar52._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
        auVar52._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
        auVar71._4_4_ = auVar52._0_4_;
        auVar71._0_4_ = auVar52._0_4_;
        auVar71._8_4_ = auVar52._8_4_;
        auVar71._12_4_ = auVar52._8_4_;
        iVar78 = -(uint)(auVar60._4_4_ == iVar62);
        iVar82 = -(uint)(auVar60._12_4_ == iVar64);
        auVar15._4_4_ = iVar78;
        auVar15._0_4_ = iVar78;
        auVar15._8_4_ = iVar82;
        auVar15._12_4_ = iVar82;
        auVar80._4_4_ = auVar52._4_4_;
        auVar80._0_4_ = auVar52._4_4_;
        auVar80._8_4_ = auVar52._12_4_;
        auVar80._12_4_ = auVar52._12_4_;
        auVar60 = auVar15 & auVar71 | auVar80;
        auVar60 = packssdw(auVar60,auVar60);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60 ^ auVar5,auVar60 ^ auVar5);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          puVar34[-0x90] = 0;
        }
        auVar60 = pshufhw(auVar60,auVar71,0x84);
        auVar16._4_4_ = iVar78;
        auVar16._0_4_ = iVar78;
        auVar16._8_4_ = iVar82;
        auVar16._12_4_ = iVar82;
        auVar65 = pshufhw(auVar52,auVar16,0x84);
        auVar40 = pshufhw(auVar60,auVar80,0x84);
        auVar43._8_4_ = 0xffffffff;
        auVar43._0_8_ = 0xffffffffffffffff;
        auVar43._12_4_ = 0xffffffff;
        auVar43 = (auVar40 | auVar65 & auVar60) ^ auVar43;
        auVar60 = packssdw(auVar43,auVar43);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60._6_2_ >> 8 & 1) != 0) {
          puVar34[-0x80] = 0;
        }
        auVar60 = (auVar57 | auVar24) ^ auVar29;
        auVar53._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
        auVar53._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
        auVar53._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
        auVar53._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
        auVar17._4_4_ = auVar53._0_4_;
        auVar17._0_4_ = auVar53._0_4_;
        auVar17._8_4_ = auVar53._8_4_;
        auVar17._12_4_ = auVar53._8_4_;
        auVar65 = pshuflw(auVar80,auVar17,0xe8);
        auVar44._0_4_ = -(uint)(auVar60._0_4_ == iVar59);
        auVar44._4_4_ = -(uint)(auVar60._4_4_ == iVar62);
        auVar44._8_4_ = -(uint)(auVar60._8_4_ == iVar63);
        auVar44._12_4_ = -(uint)(auVar60._12_4_ == iVar64);
        auVar72._4_4_ = auVar44._4_4_;
        auVar72._0_4_ = auVar44._4_4_;
        auVar72._8_4_ = auVar44._12_4_;
        auVar72._12_4_ = auVar44._12_4_;
        auVar60 = pshuflw(auVar44,auVar72,0xe8);
        auVar73._4_4_ = auVar53._4_4_;
        auVar73._0_4_ = auVar53._4_4_;
        auVar73._8_4_ = auVar53._12_4_;
        auVar73._12_4_ = auVar53._12_4_;
        auVar40 = pshuflw(auVar53,auVar73,0xe8);
        auVar54._8_4_ = 0xffffffff;
        auVar54._0_8_ = 0xffffffffffffffff;
        auVar54._12_4_ = 0xffffffff;
        auVar54 = (auVar40 | auVar60 & auVar65) ^ auVar54;
        auVar40 = packssdw(auVar54,auVar54);
        auVar60 = packsswb(auVar60 & auVar65,auVar40);
        if ((auVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          puVar34[-0x70] = 0;
        }
        auVar18._4_4_ = auVar53._0_4_;
        auVar18._0_4_ = auVar53._0_4_;
        auVar18._8_4_ = auVar53._8_4_;
        auVar18._12_4_ = auVar53._8_4_;
        auVar73 = auVar72 & auVar18 | auVar73;
        auVar40 = packssdw(auVar73,auVar73);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar40 = packssdw(auVar40 ^ auVar6,auVar40 ^ auVar6);
        auVar60 = packsswb(auVar60,auVar40);
        if ((auVar60._8_2_ >> 8 & 1) != 0) {
          puVar34[-0x60] = 0;
        }
        auVar60 = (auVar57 | auVar23) ^ auVar29;
        auVar55._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
        auVar55._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
        auVar55._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
        auVar55._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
        auVar74._4_4_ = auVar55._0_4_;
        auVar74._0_4_ = auVar55._0_4_;
        auVar74._8_4_ = auVar55._8_4_;
        auVar74._12_4_ = auVar55._8_4_;
        iVar78 = -(uint)(auVar60._4_4_ == iVar62);
        iVar82 = -(uint)(auVar60._12_4_ == iVar64);
        auVar19._4_4_ = iVar78;
        auVar19._0_4_ = iVar78;
        auVar19._8_4_ = iVar82;
        auVar19._12_4_ = iVar82;
        auVar81._4_4_ = auVar55._4_4_;
        auVar81._0_4_ = auVar55._4_4_;
        auVar81._8_4_ = auVar55._12_4_;
        auVar81._12_4_ = auVar55._12_4_;
        auVar60 = auVar19 & auVar74 | auVar81;
        auVar60 = packssdw(auVar60,auVar60);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60 ^ auVar7,auVar60 ^ auVar7);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          puVar34[-0x50] = 0;
        }
        auVar60 = pshufhw(auVar60,auVar74,0x84);
        auVar20._4_4_ = iVar78;
        auVar20._0_4_ = iVar78;
        auVar20._8_4_ = iVar82;
        auVar20._12_4_ = iVar82;
        auVar65 = pshufhw(auVar55,auVar20,0x84);
        auVar40 = pshufhw(auVar60,auVar81,0x84);
        auVar45._8_4_ = 0xffffffff;
        auVar45._0_8_ = 0xffffffffffffffff;
        auVar45._12_4_ = 0xffffffff;
        auVar45 = (auVar40 | auVar65 & auVar60) ^ auVar45;
        auVar60 = packssdw(auVar45,auVar45);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60._10_2_ >> 8 & 1) != 0) {
          puVar34[-0x40] = 0;
        }
        auVar60 = (auVar57 | _DAT_0012ca60) ^ auVar29;
        auVar56._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
        auVar56._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
        auVar56._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
        auVar56._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
        auVar21._4_4_ = auVar56._0_4_;
        auVar21._0_4_ = auVar56._0_4_;
        auVar21._8_4_ = auVar56._8_4_;
        auVar21._12_4_ = auVar56._8_4_;
        auVar65 = pshuflw(auVar81,auVar21,0xe8);
        auVar46._0_4_ = -(uint)(auVar60._0_4_ == iVar59);
        auVar46._4_4_ = -(uint)(auVar60._4_4_ == iVar62);
        auVar46._8_4_ = -(uint)(auVar60._8_4_ == iVar63);
        auVar46._12_4_ = -(uint)(auVar60._12_4_ == iVar64);
        auVar75._4_4_ = auVar46._4_4_;
        auVar75._0_4_ = auVar46._4_4_;
        auVar75._8_4_ = auVar46._12_4_;
        auVar75._12_4_ = auVar46._12_4_;
        auVar60 = pshuflw(auVar46,auVar75,0xe8);
        auVar76._4_4_ = auVar56._4_4_;
        auVar76._0_4_ = auVar56._4_4_;
        auVar76._8_4_ = auVar56._12_4_;
        auVar76._12_4_ = auVar56._12_4_;
        auVar40 = pshuflw(auVar56,auVar76,0xe8);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60 & auVar65,(auVar40 | auVar60 & auVar65) ^ auVar8);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          puVar34[-0x30] = 0;
        }
        auVar22._4_4_ = auVar56._0_4_;
        auVar22._0_4_ = auVar56._0_4_;
        auVar22._8_4_ = auVar56._8_4_;
        auVar22._12_4_ = auVar56._8_4_;
        auVar76 = auVar75 & auVar22 | auVar76;
        auVar40 = packssdw(auVar76,auVar76);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60,auVar40 ^ auVar9);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60._12_2_ >> 8 & 1) != 0) {
          puVar34[-0x20] = 0;
        }
        auVar60 = (auVar57 | _DAT_0012ca50) ^ auVar29;
        auVar47._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
        auVar47._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
        auVar47._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
        auVar47._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
        auVar77._4_4_ = auVar47._0_4_;
        auVar77._0_4_ = auVar47._0_4_;
        auVar77._8_4_ = auVar47._8_4_;
        auVar77._12_4_ = auVar47._8_4_;
        auVar58._4_4_ = -(uint)(auVar60._4_4_ == iVar62);
        auVar58._12_4_ = -(uint)(auVar60._12_4_ == iVar64);
        auVar58._0_4_ = auVar58._4_4_;
        auVar58._8_4_ = auVar58._12_4_;
        auVar61._4_4_ = auVar47._4_4_;
        auVar61._0_4_ = auVar47._4_4_;
        auVar61._8_4_ = auVar47._12_4_;
        auVar61._12_4_ = auVar47._12_4_;
        auVar40 = auVar58 & auVar77 | auVar61;
        auVar60 = packssdw(auVar47,auVar40);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60 ^ auVar10,auVar60 ^ auVar10);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          puVar34[-0x10] = 0;
        }
        auVar60 = pshufhw(auVar60,auVar77,0x84);
        in_XMM2 = pshufhw(auVar40,auVar58,0x84);
        in_XMM2 = in_XMM2 & auVar60;
        auVar60 = pshufhw(auVar60,auVar61,0x84);
        auVar48._8_4_ = 0xffffffff;
        auVar48._0_8_ = 0xffffffffffffffff;
        auVar48._12_4_ = 0xffffffff;
        auVar48 = (auVar60 | in_XMM2) ^ auVar48;
        auVar60 = packssdw(auVar48,auVar48);
        in_XMM1 = packsswb(auVar60,auVar60);
        if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
          *puVar34 = 0;
        }
        uVar35 = uVar35 + 0x10;
        puVar34 = puVar34 + 0x100;
      } while (((lVar36 - lVar38) + 0xfU & 0xfffffffffffffff0) != uVar35);
    }
  }
  return iVar30;
}

Assistant:

int luaD_reallocstack (lua_State *L, int newsize, int raiseerror) {
  int oldsize = stacksize(L);
  int i;
  StkId newstack;
  StkId oldstack = L->stack.p;
  lu_byte oldgcstop = G(L)->gcstopem;
  lua_assert(newsize <= MAXSTACK || newsize == ERRORSTACKSIZE);
  relstack(L);  /* change pointers to offsets */
  G(L)->gcstopem = 1;  /* stop emergency collection */
  newstack = luaM_reallocvector(L, oldstack, oldsize + EXTRA_STACK,
                                   newsize + EXTRA_STACK, StackValue);
  G(L)->gcstopem = oldgcstop;  /* restore emergency collection */
  if (l_unlikely(newstack == NULL)) {  /* reallocation failed? */
    correctstack(L, oldstack);  /* change offsets back to pointers */
    if (raiseerror)
      luaM_error(L);
    else return 0;  /* do not raise an error */
  }
  L->stack.p = newstack;
  correctstack(L, oldstack);  /* change offsets back to pointers */
  L->stack_last.p = L->stack.p + newsize;
  for (i = oldsize + EXTRA_STACK; i < newsize + EXTRA_STACK; i++)
    setnilvalue(s2v(newstack + i)); /* erase new segment */
  return 1;
}